

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

longlong chaiscript::bootstrap::parse_string<long_long>(string *i)

{
  longlong t;
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)i,_S_out|_S_in);
  std::istream::_M_extract<long_long>((longlong *)&ss);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return t;
}

Assistant:

Input parse_string(const std::string &i) {
    if constexpr (!std::is_same<Input, wchar_t>::value && !std::is_same<Input, char16_t>::value && !std::is_same<Input, char32_t>::value) {
      std::stringstream ss(i);
      Input t;
      ss >> t;
      return t;
    } else {
      throw std::runtime_error("Parsing of wide characters is not yet supported");
    }
  }